

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

double xmlXPathPopNumber(xmlXPathParserContextPtr ctxt)

{
  xmlXPathObjectPtr val;
  double dVar1;
  
  val = valuePop(ctxt);
  if (val == (xmlXPathObjectPtr)0x0) {
    xmlXPathErr(ctxt,10);
    dVar1 = 0.0;
    if (ctxt != (xmlXPathParserContextPtr)0x0) {
      ctxt->error = 10;
    }
  }
  else {
    if (val->type == XPATH_NUMBER) {
      dVar1 = val->floatval;
    }
    else {
      dVar1 = xmlXPathCastToNumberInternal(ctxt,val);
    }
    xmlXPathReleaseObject(ctxt->context,val);
  }
  return dVar1;
}

Assistant:

double
xmlXPathPopNumber (xmlXPathParserContextPtr ctxt) {
    xmlXPathObjectPtr obj;
    double ret;

    obj = valuePop(ctxt);
    if (obj == NULL) {
	xmlXPathSetError(ctxt, XPATH_INVALID_OPERAND);
	return(0);
    }
    if (obj->type != XPATH_NUMBER)
	ret = xmlXPathCastToNumberInternal(ctxt, obj);
    else
        ret = obj->floatval;
    xmlXPathReleaseObject(ctxt->context, obj);
    return(ret);
}